

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene_line_segments.h
# Opt level: O2

PrimInfoMB * __thiscall
embree::avx512::LineSegmentsISA::createPrimRefMBArray
          (PrimInfoMB *__return_storage_ptr__,LineSegmentsISA *this,mvector<PrimRefMB> *prims,
          BBox1f *t0t1,range<unsigned_long> *r,size_t k,uint geomID)

{
  BBox1f BVar1;
  BufferView<embree::Vec3fx> *pBVar2;
  PrimRefMB *pPVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar7;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar8;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar9;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  int iVar13;
  int iVar14;
  uint uVar15;
  ulong uVar16;
  ulong uVar17;
  size_t *psVar18;
  ulong uVar19;
  int iVar20;
  unsigned_long uVar21;
  size_t itime;
  int iVar22;
  bool bVar23;
  float fVar24;
  float fVar25;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  float fVar46;
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  float fVar47;
  undefined1 auVar45 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  float fVar53;
  float fVar54;
  undefined1 auVar52 [64];
  undefined1 auVar55 [16];
  undefined1 auVar56 [64];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [64];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [64];
  undefined1 auVar66 [64];
  undefined1 auVar67 [64];
  undefined1 auVar68 [64];
  undefined1 auVar69 [64];
  undefined1 in_ZMM17 [64];
  undefined1 auVar70 [64];
  undefined1 auVar71 [64];
  undefined1 auVar72 [64];
  float local_208;
  float fStack_204;
  float fStack_200;
  float fStack_1fc;
  float local_1f8;
  float fStack_1f4;
  float fStack_1f0;
  float fStack_1ec;
  ulong local_190;
  anon_class_16_2_4e716a3c local_188;
  BBox<embree::Vec3fa> bupper1;
  BBox<embree::Vec3fa> blower0;
  BBox<embree::Vec3fa> bi;
  BBox<embree::Vec3fa> bupper0;
  BBox<embree::Vec3fa> blower1;
  
  (__return_storage_ptr__->object_range)._begin = 0;
  uVar21 = r->_begin;
  auVar56 = ZEXT464(0x3f800000);
  auVar27._8_4_ = 0x7f800000;
  auVar27._0_8_ = 0x7f8000007f800000;
  auVar27._12_4_ = 0x7f800000;
  auVar65 = ZEXT1664(auVar27);
  auVar26._8_4_ = 0xff800000;
  auVar26._0_8_ = 0xff800000ff800000;
  auVar26._12_4_ = 0xff800000;
  auVar61 = ZEXT1664(auVar26);
  fVar24 = 1.0;
  auVar52 = ZEXT1664(ZEXT816(0) << 0x40);
  uVar19 = 0;
  auVar66 = ZEXT1664(CONCAT412(0xddccb9a2,CONCAT48(0xddccb9a2,0xddccb9a2ddccb9a2)));
  auVar67 = ZEXT1664(CONCAT412(0x5dccb9a2,CONCAT48(0x5dccb9a2,0x5dccb9a25dccb9a2)));
  fVar25 = 0.0;
  auVar68 = ZEXT1664(auVar26);
  auVar69 = ZEXT1664(auVar27);
  auVar71 = ZEXT1664(auVar26);
  auVar72 = ZEXT1664(auVar27);
  auVar26 = vpxord_avx512vl(in_ZMM17._0_16_,in_ZMM17._0_16_);
  auVar70 = ZEXT1664(auVar26);
  while( true ) {
    auVar26 = auVar56._0_16_;
    if (r->_end <= uVar21) {
      (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds0.
      lower.field_0 = auVar72._0_16_;
      (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds0.
      upper.field_0 = auVar71._0_16_;
      (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds1.
      lower.field_0 = auVar69._0_16_;
      (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds1.
      upper.field_0 = auVar68._0_16_;
      (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).centBounds.lower.
      field_0 = auVar65._0_16_;
      (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).centBounds.upper.
      field_0 = auVar61._0_16_;
      BVar1 = (BBox1f)vmovlps_avx(auVar26);
      __return_storage_ptr__->time_range = BVar1;
      auVar26 = vmovdqu64_avx512vl(auVar70._0_16_);
      *(undefined1 (*) [16])&(__return_storage_ptr__->object_range)._end = auVar26;
      __return_storage_ptr__->max_num_time_segments = uVar19;
      (__return_storage_ptr__->max_time_range).lower = fVar25;
      (__return_storage_ptr__->max_time_range).upper = fVar24;
      return __return_storage_ptr__;
    }
    BVar1 = (this->super_LineSegments).super_Geometry.time_range;
    auVar28._8_8_ = 0;
    auVar28._0_4_ = BVar1.lower;
    auVar28._4_4_ = BVar1.upper;
    auVar27 = vmovshdup_avx(auVar28);
    fVar31 = BVar1.lower;
    fVar32 = auVar27._0_4_ - fVar31;
    uVar15 = *(uint *)(*(long *)&(this->super_LineSegments).super_Geometry.field_0x58 +
                      *(long *)&(this->super_LineSegments).field_0x68 * uVar21);
    uVar16 = (ulong)(uVar15 + 1);
    pBVar2 = (this->super_LineSegments).vertices.items;
    if (uVar16 < (pBVar2->super_RawBufferView).num) break;
LAB_01c4de57:
    uVar21 = uVar21 + 1;
  }
  fVar33 = (this->super_LineSegments).super_Geometry.fnumTimeSegments;
  auVar27 = vmulss_avx512f(ZEXT416((uint)fVar33),
                           ZEXT416((uint)(((t0t1->upper - fVar31) / fVar32) * 0.99999976)));
  auVar27 = vroundss_avx(auVar27,auVar27,10);
  auVar28 = vminss_avx512f(auVar27,ZEXT416((uint)fVar33));
  auVar29 = vdivss_avx512f(ZEXT416((uint)(t0t1->lower - fVar31)),ZEXT416((uint)fVar32));
  auVar27 = vmulss_avx512f(auVar29,SUB6416(ZEXT464(0x3f800002),0));
  auVar27 = vmulss_avx512f(ZEXT416((uint)fVar33),auVar27);
  auVar27 = vroundss_avx(auVar27,auVar27,9);
  auVar27 = vmaxss_avx(auVar52._0_16_,auVar27);
  psVar18 = &pBVar2[(int)auVar27._0_4_].super_RawBufferView.stride;
  uVar17 = (long)(int)auVar27._0_4_ - 1;
LAB_01c4da6a:
  uVar17 = uVar17 + 1;
  if ((ulong)(long)(int)auVar28._0_4_ < uVar17) {
    auVar27 = vmovdqa64_avx512vl(auVar70._0_16_);
    local_188.primID = &local_190;
    fVar32 = (t0t1->upper - fVar31) / fVar32;
    auVar30 = vmulss_avx512f(ZEXT416((uint)fVar33),auVar29);
    fVar31 = fVar33 * fVar32;
    auVar64 = vroundss_avx(auVar30,auVar30,9);
    auVar45 = vroundss_avx(ZEXT416((uint)fVar31),ZEXT416((uint)fVar31),10);
    auVar28 = vmaxss_avx(auVar64,auVar52._0_16_);
    auVar60 = vminss_avx(auVar45,ZEXT416((uint)fVar33));
    iVar20 = (int)auVar28._0_4_;
    fVar35 = auVar60._0_4_;
    iVar14 = (int)auVar64._0_4_;
    iVar22 = -1;
    if (-1 < iVar14) {
      iVar22 = iVar14;
    }
    iVar13 = (int)fVar33 + 1;
    if ((int)auVar45._0_4_ < (int)fVar33 + 1) {
      iVar13 = (int)auVar45._0_4_;
    }
    local_190 = uVar21;
    local_188.this = &this->super_LineSegments;
    LineSegments::linearBounds::anon_class_16_2_4e716a3c::operator()
              (&blower0,&local_188,(long)iVar20);
    LineSegments::linearBounds::anon_class_16_2_4e716a3c::operator()
              (&bupper1,&local_188,(long)(int)fVar35);
    fVar46 = auVar30._0_4_ - auVar28._0_4_;
    if (iVar13 - iVar22 == 1) {
      auVar28 = vmaxss_avx(ZEXT416((uint)fVar46),ZEXT816(0) << 0x40);
      fVar33 = auVar28._0_4_;
      fVar32 = 1.0 - fVar33;
      auVar57._0_4_ = fVar33 * bupper1.lower.field_0._0_4_;
      auVar57._4_4_ = fVar33 * bupper1.lower.field_0._4_4_;
      auVar57._8_4_ = fVar33 * bupper1.lower.field_0._8_4_;
      auVar57._12_4_ = fVar33 * bupper1.lower.field_0._12_4_;
      auVar29._4_4_ = fVar32;
      auVar29._0_4_ = fVar32;
      auVar29._8_4_ = fVar32;
      auVar29._12_4_ = fVar32;
      auVar60 = vfmadd231ps_fma(auVar57,auVar29,(undefined1  [16])blower0.lower.field_0);
      auVar62._0_4_ = fVar33 * bupper1.upper.field_0._0_4_;
      auVar62._4_4_ = fVar33 * bupper1.upper.field_0._4_4_;
      auVar62._8_4_ = fVar33 * bupper1.upper.field_0._8_4_;
      auVar62._12_4_ = fVar33 * bupper1.upper.field_0._12_4_;
      auVar64 = vfmadd231ps_fma(auVar62,(undefined1  [16])blower0.upper.field_0,auVar29);
      auVar28 = vmaxss_avx(ZEXT416((uint)(fVar35 - fVar31)),ZEXT816(0) << 0x40);
      fVar31 = auVar28._0_4_;
      fVar32 = 1.0 - fVar31;
      auVar43._0_4_ = fVar31 * blower0.lower.field_0._0_4_;
      auVar43._4_4_ = fVar31 * blower0.lower.field_0._4_4_;
      auVar43._8_4_ = fVar31 * blower0.lower.field_0._8_4_;
      auVar43._12_4_ = fVar31 * blower0.lower.field_0._12_4_;
      auVar38._4_4_ = fVar32;
      auVar38._0_4_ = fVar32;
      auVar38._8_4_ = fVar32;
      auVar38._12_4_ = fVar32;
      auVar45 = vfmadd231ps_fma(auVar43,auVar38,(undefined1  [16])bupper1.lower.field_0);
      auVar48._0_4_ = fVar31 * blower0.upper.field_0._0_4_;
      auVar48._4_4_ = fVar31 * blower0.upper.field_0._4_4_;
      auVar48._8_4_ = fVar31 * blower0.upper.field_0._8_4_;
      auVar48._12_4_ = fVar31 * blower0.upper.field_0._12_4_;
      auVar30 = vfmadd231ps_fma(auVar48,auVar38,(undefined1  [16])bupper1.upper.field_0);
    }
    else {
      LineSegments::linearBounds::anon_class_16_2_4e716a3c::operator()
                (&blower1,&local_188,(long)(iVar20 + 1));
      LineSegments::linearBounds::anon_class_16_2_4e716a3c::operator()
                (&bupper0,&local_188,(long)((int)fVar35 + -1));
      auVar28 = vmaxss_avx(ZEXT416((uint)fVar46),ZEXT816(0) << 0x40);
      fVar34 = auVar28._0_4_;
      fVar46 = 1.0 - fVar34;
      auVar59._0_4_ = fVar34 * blower1.lower.field_0.m128[0];
      auVar59._4_4_ = fVar34 * blower1.lower.field_0.m128[1];
      auVar59._8_4_ = fVar34 * blower1.lower.field_0.m128[2];
      auVar59._12_4_ = fVar34 * blower1.lower.field_0.m128[3];
      auVar39._4_4_ = fVar46;
      auVar39._0_4_ = fVar46;
      auVar39._8_4_ = fVar46;
      auVar39._12_4_ = fVar46;
      auVar60 = vfmadd231ps_fma(auVar59,auVar39,(undefined1  [16])blower0.lower.field_0);
      auVar63._0_4_ = fVar34 * blower1.upper.field_0.m128[0];
      auVar63._4_4_ = fVar34 * blower1.upper.field_0.m128[1];
      auVar63._8_4_ = fVar34 * blower1.upper.field_0.m128[2];
      auVar63._12_4_ = fVar34 * blower1.upper.field_0.m128[3];
      auVar64 = vfmadd231ps_fma(auVar63,auVar39,(undefined1  [16])blower0.upper.field_0);
      auVar28 = vmaxss_avx(ZEXT416((uint)(fVar35 - fVar31)),ZEXT816(0) << 0x40);
      fVar35 = auVar28._0_4_;
      fVar31 = 1.0 - fVar35;
      auVar44._0_4_ = fVar35 * bupper0.lower.field_0.m128[0];
      auVar44._4_4_ = fVar35 * bupper0.lower.field_0.m128[1];
      auVar44._8_4_ = fVar35 * bupper0.lower.field_0.m128[2];
      auVar44._12_4_ = fVar35 * bupper0.lower.field_0.m128[3];
      auVar40._4_4_ = fVar31;
      auVar40._0_4_ = fVar31;
      auVar40._8_4_ = fVar31;
      auVar40._12_4_ = fVar31;
      auVar45 = vfmadd231ps_fma(auVar44,auVar40,(undefined1  [16])bupper1.lower.field_0);
      auVar51._0_4_ = fVar35 * bupper0.upper.field_0.m128[0];
      auVar51._4_4_ = fVar35 * bupper0.upper.field_0.m128[1];
      auVar51._8_4_ = fVar35 * bupper0.upper.field_0.m128[2];
      auVar51._12_4_ = fVar35 * bupper0.upper.field_0.m128[3];
      auVar30 = vfmadd231ps_fma(auVar51,auVar40,(undefined1  [16])bupper1.upper.field_0);
      if (iVar14 < 0) {
        iVar14 = -1;
      }
      itime = (size_t)iVar14;
      while (itime = itime + 1, (long)itime < (long)iVar13) {
        fVar35 = ((float)(int)itime / fVar33 - auVar29._0_4_) / (fVar32 - auVar29._0_4_);
        fVar31 = 1.0 - fVar35;
        auVar42._0_4_ = auVar45._0_4_ * fVar35;
        fVar46 = auVar45._4_4_;
        auVar42._4_4_ = fVar46 * fVar35;
        fVar34 = auVar45._8_4_;
        auVar42._8_4_ = fVar34 * fVar35;
        fVar47 = auVar45._12_4_;
        auVar42._12_4_ = fVar47 * fVar35;
        auVar41._4_4_ = fVar31;
        auVar41._0_4_ = fVar31;
        auVar41._8_4_ = fVar31;
        auVar41._12_4_ = fVar31;
        auVar28 = vfmadd231ps_fma(auVar42,auVar41,auVar60);
        auVar37._0_4_ = auVar30._0_4_ * fVar35;
        fVar31 = auVar30._4_4_;
        auVar37._4_4_ = fVar31 * fVar35;
        fVar53 = auVar30._8_4_;
        auVar37._8_4_ = fVar53 * fVar35;
        fVar54 = auVar30._12_4_;
        auVar37._12_4_ = fVar54 * fVar35;
        auVar39 = vfmadd231ps_fma(auVar37,auVar64,auVar41);
        LineSegments::linearBounds::anon_class_16_2_4e716a3c::operator()(&bi,&local_188,itime);
        local_208 = auVar64._0_4_;
        fStack_204 = auVar64._4_4_;
        fStack_200 = auVar64._8_4_;
        fStack_1fc = auVar64._12_4_;
        local_1f8 = auVar60._0_4_;
        fStack_1f4 = auVar60._4_4_;
        fStack_1f0 = auVar60._8_4_;
        fStack_1ec = auVar60._12_4_;
        auVar28 = vsubps_avx((undefined1  [16])bi.lower.field_0,auVar28);
        auVar60 = vsubps_avx((undefined1  [16])bi.upper.field_0,auVar39);
        auVar64 = vminps_avx(auVar28,ZEXT816(0) << 0x40);
        auVar28 = vmaxps_avx(auVar60,ZEXT816(0) << 0x40);
        auVar60._0_4_ = local_1f8 + auVar64._0_4_;
        auVar60._4_4_ = fStack_1f4 + auVar64._4_4_;
        auVar60._8_4_ = fStack_1f0 + auVar64._8_4_;
        auVar60._12_4_ = fStack_1ec + auVar64._12_4_;
        auVar45._0_4_ = auVar45._0_4_ + auVar64._0_4_;
        auVar45._4_4_ = fVar46 + auVar64._4_4_;
        auVar45._8_4_ = fVar34 + auVar64._8_4_;
        auVar45._12_4_ = fVar47 + auVar64._12_4_;
        auVar64._0_4_ = local_208 + auVar28._0_4_;
        auVar64._4_4_ = fStack_204 + auVar28._4_4_;
        auVar64._8_4_ = fStack_200 + auVar28._8_4_;
        auVar64._12_4_ = fStack_1fc + auVar28._12_4_;
        auVar30._0_4_ = auVar30._0_4_ + auVar28._0_4_;
        auVar30._4_4_ = fVar31 + auVar28._4_4_;
        auVar30._8_4_ = fVar53 + auVar28._8_4_;
        auVar30._12_4_ = fVar54 + auVar28._12_4_;
      }
    }
    aVar7 = (anon_union_16_2_47237d3f_for_Vec3fx_0)vinsertps_avx(auVar60,ZEXT416(geomID),0x30);
    uVar15 = (this->super_LineSegments).super_Geometry.numTimeSteps - 1;
    uVar17 = (ulong)uVar15;
    BVar1 = (this->super_LineSegments).super_Geometry.time_range;
    auVar36._8_8_ = 0;
    auVar36._0_4_ = BVar1.lower;
    auVar36._4_4_ = BVar1.upper;
    aVar8 = (anon_union_16_2_47237d3f_for_Vec3fx_0)vinsertps_avx(auVar64,ZEXT416((uint)uVar21),0x30)
    ;
    aVar9 = (anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1)
            vinsertps_avx(auVar45,ZEXT416(uVar15),0x30);
    aVar10 = (anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1)
             vinsertps_avx(auVar30,ZEXT416(uVar15),0x30);
    auVar58._8_4_ = 0x3f000000;
    auVar58._0_8_ = 0x3f0000003f000000;
    auVar58._12_4_ = 0x3f000000;
    auVar49._0_4_ = aVar9.x * 0.5;
    auVar49._4_4_ = aVar9.y * 0.5;
    auVar49._8_4_ = aVar9.z * 0.5;
    auVar49._12_4_ = aVar9.field_3.w * 0.5;
    auVar28 = vfmadd231ps_fma(auVar49,(undefined1  [16])aVar7,auVar58);
    auVar55._0_4_ = aVar10.x * 0.5;
    auVar55._4_4_ = aVar10.y * 0.5;
    auVar55._8_4_ = aVar10.z * 0.5;
    auVar55._12_4_ = aVar10.field_3.w * 0.5;
    auVar29 = vfmadd231ps_fma(auVar55,(undefined1  [16])aVar8,auVar58);
    auVar50._0_4_ = auVar28._0_4_ + auVar29._0_4_;
    auVar50._4_4_ = auVar28._4_4_ + auVar29._4_4_;
    auVar50._8_4_ = auVar28._8_4_ + auVar29._8_4_;
    auVar50._12_4_ = auVar28._12_4_ + auVar29._12_4_;
    auVar28 = vminps_avx512vl((undefined1  [16])auVar72._0_16_,(undefined1  [16])aVar7);
    auVar72 = ZEXT1664(auVar28);
    auVar28 = vmaxps_avx512vl((undefined1  [16])auVar71._0_16_,(undefined1  [16])aVar8);
    auVar71 = ZEXT1664(auVar28);
    auVar28 = vminps_avx512vl((undefined1  [16])auVar69._0_16_,(undefined1  [16])aVar9);
    auVar69 = ZEXT1664(auVar28);
    auVar28 = vmaxps_avx((undefined1  [16])auVar68._0_16_,(undefined1  [16])aVar10);
    auVar68 = ZEXT1664(auVar28);
    auVar28 = vminps_avx((undefined1  [16])auVar65._0_16_,auVar50);
    auVar65 = ZEXT1664(auVar28);
    auVar28 = vmaxps_avx((undefined1  [16])auVar61._0_16_,auVar50);
    auVar61 = ZEXT1664(auVar28);
    uVar16 = vcmpps_avx512vl(auVar26,auVar36,1);
    auVar28 = vinsertps_avx(auVar26,auVar36,0x50);
    auVar26 = vblendps_avx(auVar36,auVar26,2);
    bVar23 = (bool)((byte)uVar16 & 1);
    bVar4 = (bool)((byte)(uVar16 >> 1) & 1);
    bVar5 = (bool)((byte)(uVar16 >> 2) & 1);
    bVar6 = (bool)((byte)(uVar16 >> 3) & 1);
    auVar56 = ZEXT1664(CONCAT412((uint)bVar6 * auVar28._12_4_ | (uint)!bVar6 * auVar26._12_4_,
                                 CONCAT48((uint)bVar5 * auVar28._8_4_ | (uint)!bVar5 * auVar26._8_4_
                                          ,CONCAT44((uint)bVar4 * auVar28._4_4_ |
                                                    (uint)!bVar4 * auVar26._4_4_,
                                                    (uint)bVar23 * auVar28._0_4_ |
                                                    (uint)!bVar23 * auVar26._0_4_))));
    auVar26 = vpmovsxbq_avx(ZEXT216(0x101));
    auVar26 = vpinsrq_avx(auVar26,uVar17,1);
    auVar27 = vmovdqa64_avx512vl(auVar27);
    auVar26 = vpaddq_avx512vl(auVar27,auVar26);
    auVar70 = ZEXT1664(auVar26);
    bVar23 = uVar19 < uVar17;
    auVar26 = vmovshdup_avx(auVar36);
    fVar24 = (float)((uint)bVar23 * auVar26._0_4_ + (uint)!bVar23 * (int)fVar24);
    fVar25 = (float)((uint)bVar23 * (int)BVar1.lower + (uint)!bVar23 * (int)fVar25);
    if (uVar19 <= uVar17) {
      uVar19 = uVar17;
    }
    pPVar3 = prims->items;
    pPVar3[k].lbounds.bounds0.lower.field_0 = aVar7;
    pPVar3[k].lbounds.bounds0.upper.field_0 = aVar8;
    pPVar3[k].lbounds.bounds1.lower.field_0.field_1 = aVar9;
    pPVar3[k].lbounds.bounds1.upper.field_0.field_1 = aVar10;
    pPVar3[k].time_range = BVar1;
    auVar52 = ZEXT864(0) << 0x20;
    auVar66 = ZEXT1664(CONCAT412(0xddccb9a2,CONCAT48(0xddccb9a2,0xddccb9a2ddccb9a2)));
    auVar67 = ZEXT1664(CONCAT412(0x5dccb9a2,CONCAT48(0x5dccb9a2,0x5dccb9a25dccb9a2)));
    k = k + 1;
  }
  else {
    auVar27 = *(undefined1 (*) [16])
               (((RawBufferView *)(psVar18 + -2))->ptr_ofs + *psVar18 * (ulong)uVar15);
    uVar11 = vcmpps_avx512vl(auVar27,auVar66._0_16_,6);
    uVar12 = vcmpps_avx512vl(auVar27,auVar67._0_16_,1);
    if ((byte)((byte)uVar11 & (byte)uVar12) == 0xf) {
      auVar60 = *(undefined1 (*) [16])
                 (((RawBufferView *)(psVar18 + -2))->ptr_ofs + *psVar18 * uVar16);
      uVar11 = vcmpps_avx512vl(auVar60,auVar66._0_16_,6);
      uVar12 = vcmpps_avx512vl(auVar60,auVar67._0_16_,1);
      if ((byte)((byte)uVar11 & (byte)uVar12) == 0xf) goto code_r0x01c4dac0;
    }
  }
  goto LAB_01c4de57;
code_r0x01c4dac0:
  psVar18 = psVar18 + 7;
  auVar27 = vshufps_avx(auVar27,auVar27,0xff);
  auVar60 = vshufps_avx(auVar60,auVar60,0xff);
  auVar27 = vminss_avx(auVar27,auVar60);
  if (auVar27._0_4_ < 0.0) goto LAB_01c4de57;
  goto LAB_01c4da6a;
}

Assistant:

PrimInfoMB createPrimRefMBArray(mvector<PrimRefMB>& prims, const BBox1f& t0t1, const range<size_t>& r, size_t k, unsigned int geomID) const
      {
        PrimInfoMB pinfo(empty);
        for (size_t j=r.begin(); j<r.end(); j++)
        {
          if (!valid(j, timeSegmentRange(t0t1))) continue;
          const PrimRefMB prim(linearBounds(j,t0t1),this->numTimeSegments(),this->time_range,this->numTimeSegments(),geomID,unsigned(j));
          pinfo.add_primref(prim);
          prims[k++] = prim;
        }
        return pinfo;
      }